

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

int fy_atom_iter_getc(fy_atom_iter *iter)

{
  uint uVar1;
  ssize_t sVar2;
  int c;
  ssize_t nread;
  fy_atom_iter *pfStack_18;
  uint8_t buf;
  fy_atom_iter *iter_local;
  
  if (iter == (fy_atom_iter *)0x0) {
    iter_local._4_4_ = 0xffffffff;
  }
  else if (iter->unget_c == -1) {
    pfStack_18 = iter;
    sVar2 = fy_atom_iter_read(iter,(void *)((long)&nread + 7),1);
    if (sVar2 == 1) {
      iter_local._4_4_ = (uint)nread._7_1_;
    }
    else {
      iter_local._4_4_ = 0xffffffff;
    }
  }
  else {
    uVar1 = iter->unget_c;
    iter->unget_c = -1;
    iter_local._4_4_ = uVar1 & 0xff;
  }
  return iter_local._4_4_;
}

Assistant:

int fy_atom_iter_getc(struct fy_atom_iter *iter) {
    uint8_t buf;
    ssize_t nread;
    int c;

    if (!iter)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf, 1);
    if (nread != 1)
        return -1;

    return (int) buf & 0xff;
}